

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::StartStatement(ByteCodeWriter *this,ParseNode *node,uint32 tmpRegCount)

{
  if (this->m_pMatchingNode == (ParseNode *)0x0) {
    if (this->useBranchIsland == true) {
      EnsureLongBranch(this,StatementBoundary);
    }
    this->m_pMatchingNode = node;
    this->m_beginCodeSpan = (this->m_byteCodeData).currentOffset;
    if ((this->m_isInDebugMode == true) && (this->m_tmpRegCount != tmpRegCount)) {
      Unsigned1(this,EmitTmpRegCount,tmpRegCount);
      this->m_tmpRegCount = tmpRegCount;
    }
  }
  else if (this->m_pMatchingNode == node) {
    this->m_matchingNodeRefCount = this->m_matchingNodeRefCount + 1;
  }
  return;
}

Assistant:

void ByteCodeWriter::StartStatement(ParseNode* node, uint32 tmpRegCount)
    {
        if (m_pMatchingNode)
        {
            if (m_pMatchingNode == node)
            {
                m_matchingNodeRefCount++;
            }
            return;
        }
#ifdef BYTECODE_BRANCH_ISLAND
        if (useBranchIsland)
        {
            // If we are going to emit a branch island, it should be before the statement start
            this->EnsureLongBranch(Js::OpCode::StatementBoundary);
        }
#endif
        m_pMatchingNode = node;
        m_beginCodeSpan = m_byteCodeData.GetCurrentOffset();

        if (m_isInDebugMode && m_tmpRegCount != tmpRegCount)
        {
            Unsigned1(OpCode::EmitTmpRegCount, tmpRegCount);
            m_tmpRegCount = tmpRegCount;
        }
    }